

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Expression __thiscall cnn::expr::transpose(expr *this,Expression *x)

{
  ComputationGraph *arguments;
  undefined8 extraout_RDX;
  Expression EVar1;
  uint local_24;
  uint *local_20;
  undefined8 local_18;
  
  arguments = x->pg;
  local_24 = (x->i).t;
  local_20 = &local_24;
  local_18 = 1;
  ComputationGraph::add_function<cnn::Transpose>
            ((ComputationGraph *)(this + 8),(initializer_list<cnn::VariableIndex> *)arguments);
  *(ComputationGraph **)this = arguments;
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = (ComputationGraph *)this;
  return EVar1;
}

Assistant:

Expression transpose(const Expression& x) { return Expression(x.pg, x.pg->add_function<Transpose>({x.i})); }